

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host-utils.h
# Opt level: O1

uint32_t helper_cntlzw32_ppc(uint32_t val)

{
  uint uVar1;
  
  if (val != 0) {
    uVar1 = 0x1f;
    if (val != 0) {
      for (; val >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    return uVar1 ^ 0x1f;
  }
  return 0x20;
}

Assistant:

static inline int clz32(uint32_t val)
{
#ifndef _MSC_VER
    return val ? __builtin_clz(val) : 32;
#else
    /* Binary search for the leading one bit.  */
    int cnt = 0;

    if (!(val & 0xFFFF0000U)) {
        cnt += 16;
        val <<= 16;
    }
    if (!(val & 0xFF000000U)) {
        cnt += 8;
        val <<= 8;
    }
    if (!(val & 0xF0000000U)) {
        cnt += 4;
        val <<= 4;
    }
    if (!(val & 0xC0000000U)) {
        cnt += 2;
        val <<= 2;
    }
    if (!(val & 0x80000000U)) {
        cnt++;
        val <<= 1;
    }
    if (!(val & 0x80000000U)) {
        cnt++;
    }
    return cnt;
#endif
}